

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaO_rawequalObj(TValue *t1,TValue *t2)

{
  TValue *t2_local;
  TValue *t1_local;
  
  if (t1->tt == t2->tt) {
    switch(t1->tt) {
    case 0:
      t1_local._4_4_ = 1;
      break;
    case 1:
      t1_local._4_4_ = (uint)((t1->value).b == (t2->value).b);
      break;
    case 2:
      t1_local._4_4_ = (uint)((t1->value).gc == (t2->value).gc);
      break;
    case 3:
      t1_local._4_4_ = (uint)((t1->value).n == (t2->value).n);
      break;
    default:
      t1_local._4_4_ = (uint)((t1->value).gc == (t2->value).gc);
    }
  }
  else {
    t1_local._4_4_ = 0;
  }
  return t1_local._4_4_;
}

Assistant:

static int luaO_rawequalObj(const TValue*t1,const TValue*t2){
if(ttype(t1)!=ttype(t2))return 0;
else switch(ttype(t1)){
case 0:
return 1;
case 3:
return luai_numeq(nvalue(t1),nvalue(t2));
case 1:
return bvalue(t1)==bvalue(t2);
case 2:
return pvalue(t1)==pvalue(t2);
default:
return gcvalue(t1)==gcvalue(t2);
}
}